

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printEventField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,Event *event,WriterProp *writerProp)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  undefined1 in_DL;
  OstreamBuffer *in_RSI;
  string *in_stack_ffffffffffffff18;
  char c;
  OstreamBuffer *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  OstreamBuffer *in_stack_ffffffffffffff30;
  uint64_t in_stack_ffffffffffffff70;
  OstreamBuffer *in_stack_ffffffffffffff78;
  PrettyPrinter *in_stack_ffffffffffffff80;
  uint64_t in_stack_ffffffffffffff90;
  OstreamBuffer *in_stack_ffffffffffffff98;
  PrettyPrinter *in_stack_ffffffffffffffa0;
  OstreamBuffer *in_stack_ffffffffffffffa8;
  PrettyPrinter *in_stack_ffffffffffffffb0;
  
  c = (char)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  switch(in_DL) {
  case 0x25:
    detail::OstreamBuffer::put(in_stack_ffffffffffffff20,c);
    break;
  default:
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,c);
    detail::OstreamBuffer::operator<<
              (in_stack_ffffffffffffff20,(char)((ulong)in_stack_ffffffffffffff18 >> 0x38));
    break;
  case 0x43:
    mserialize::string_view::string_view
              ((string_view *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    str_00._len = (size_t)in_stack_ffffffffffffff30;
    str_00._ptr = (char *)in_stack_ffffffffffffff28;
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,str_00);
    break;
  case 0x46:
    mserialize::string_view::string_view
              ((string_view *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    str_02._len = (size_t)in_RSI;
    str_02._ptr = (char *)in_stack_ffffffffffffff28;
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,str_02);
    break;
  case 0x47:
    anon_unknown.dwarf_233a7c::printFilename(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    break;
  case 0x49:
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18)
    ;
    break;
  case 0x4c:
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18)
    ;
    break;
  case 0x4d:
    mserialize::string_view::string_view
              ((string_view *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    str_01._len = (size_t)in_stack_ffffffffffffff30;
    str_01._ptr = (char *)in_stack_ffffffffffffff28;
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,str_01);
    break;
  case 0x50:
    mserialize::string_view::string_view
              ((string_view *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    str_03._len = (size_t)in_stack_ffffffffffffff30;
    str_03._ptr = (char *)in_RSI;
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,str_03);
    break;
  case 0x53:
    severityToString((Severity)in_stack_ffffffffffffff20);
    mserialize::cx_string::operator_cast_to_string_view((cx_string<4UL> *)0x27276f);
    str._len = (size_t)in_stack_ffffffffffffff30;
    str._ptr = (char *)in_stack_ffffffffffffff28;
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,str);
    break;
  case 0x54:
    mserialize::string_view::string_view((string_view *)in_RSI,in_stack_ffffffffffffff18);
    str_04._len = (size_t)in_stack_ffffffffffffff30;
    str_04._ptr = (char *)in_stack_ffffffffffffff28;
    detail::OstreamBuffer::operator<<(in_RSI,str_04);
    break;
  case 100:
    printProducerLocalTime
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    break;
  case 0x6d:
    printEventMessage(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                      (Event *)in_stack_ffffffffffffffa0);
    break;
  case 0x6e:
    mserialize::string_view::string_view((string_view *)in_stack_ffffffffffffff20,(string *)in_RSI);
    str_05._len = (size_t)in_stack_ffffffffffffff30;
    str_05._ptr = (char *)in_stack_ffffffffffffff28;
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,str_05);
    break;
  case 0x72:
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18)
    ;
    break;
  case 0x74:
    detail::OstreamBuffer::operator<<(in_stack_ffffffffffffff20,(uint64_t)in_stack_ffffffffffffff18)
    ;
    break;
  case 0x75:
    printUTCTime(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void PrettyPrinter::printEventField(
  detail::OstreamBuffer& out,
  char spec,
  const Event& event,
  const WriterProp& writerProp
) const
{
  switch (spec)
  {
  case 'I':
    out << event.source->id;
    break;
  case 'S':
    out << severityToString(event.source->severity);
    break;
  case 'C':
    out << event.source->category;
    break;
  case 'M':
    out << event.source->function;
    break;
  case 'F':
    out << event.source->file;
    break;
  case 'G':
    printFilename(out, event.source->file);
    break;
  case 'L':
    out << event.source->line;
    break;
  case 'P':
    out << event.source->formatString;
    break;
  case 'T':
    out << event.source->argumentTags;
    break;
  case 'n':
    out << writerProp.name;
    break;
  case 't':
    out << writerProp.id;
    break;
  case 'd':
    printProducerLocalTime(out, event.clockValue);
    break;
  case 'u':
    printUTCTime(out, event.clockValue);
    break;
  case 'r':
    out << event.clockValue;
    break;
  case 'm':
    printEventMessage(out, event);
    break;
  case '%':
    out.put('%');
    break;
  default:
    out << '%' << spec;
    break;
  }
}